

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContinuumPlasticVonMises::ComputePlasticStrainFlow
          (ChContinuumPlasticVonMises *this,ChStrainTensor<double> *mplasticstrainflow,
          ChStrainTensor<double> *mtotstrain)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ActualDstType actualDst;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar5 = *(undefined1 (*) [16])
            (mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array;
  auVar11 = vsubpd_avx(auVar5,*(undefined1 (*) [16])
                               ((mtotstrain->super_ChVoightTensor<double>).
                                super_ChVectorN<double,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array + 1));
  dVar1 = (mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] -
          auVar5._0_8_;
  dVar4 = (mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [3];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar4 * dVar4;
  auVar5 = vfmadd231sd_fma(auVar10,auVar5,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [5];
  auVar5 = vfmadd213sd_fma(auVar6,auVar6,auVar5);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar5._0_8_ * 3.0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1 * dVar1 + auVar11._0_8_ * auVar11._0_8_ + auVar11._8_8_ * auVar11._8_8_;
  auVar5 = vfmadd231sd_fma(auVar7,auVar8,ZEXT816(0x3fe0000000000000));
  if (auVar5._0_8_ < 0.0) {
    dVar4 = sqrt(auVar5._0_8_);
  }
  else {
    auVar5 = vsqrtsd_avx(auVar5,auVar5);
    dVar4 = auVar5._0_8_;
  }
  if (dVar4 <= this->elastic_yeld) {
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  }
  else {
    dVar1 = (mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    dVar4 = (dVar4 - this->elastic_yeld) / dVar4;
    dVar9 = ((mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
             + (mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1] + (mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[2]) / 3.0;
    auVar11._8_8_ = dVar9;
    auVar11._0_8_ = dVar9;
    dVar2 = (mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    dVar3 = (mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    auVar5 = vsubpd_avx(*(undefined1 (*) [16])
                         (mtotstrain->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array,auVar11);
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         dVar4 * auVar5._0_8_;
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         dVar4 * auVar5._8_8_;
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         dVar4 * (dVar1 - dVar9);
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         dVar4 * 0.0;
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         dVar4 * dVar2;
    (mplasticstrainflow->super_ChVoightTensor<double>).super_ChVectorN<double,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         dVar4 * dVar3;
  }
  return;
}

Assistant:

void ChContinuumPlasticVonMises::ComputePlasticStrainFlow(ChStrainTensor<>& mplasticstrainflow,
                                                          const ChStrainTensor<>& mtotstrain) const {
    double vonm = mtotstrain.GetEquivalentVonMises();
    if (vonm > this->elastic_yeld) {
        ChVoightTensor<> mdev;
        mtotstrain.GetDeviatoricPart(mdev);
        mplasticstrainflow = mdev * ((vonm - this->elastic_yeld) / (vonm));
    } else {
        mplasticstrainflow.setZero();
    }
}